

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O0

void __thiscall
slang::ast::ASTVisitor<no_latches_on_design::MainVisitor,_true,_false,_false,_false>::
visitDefault<slang::ast::CovergroupType>
          (ASTVisitor<no_latches_on_design::MainVisitor,_true,_false,_false,_false> *this,
          CovergroupType *t)

{
  bool bVar1;
  iterator this_00;
  iterator visitor;
  iterator *in_RDI;
  Symbol *member;
  iterator __end0;
  iterator __begin0;
  subrange<slang::ast::Scope::iterator,_slang::ast::Scope::iterator,_(std::ranges::subrange_kind)0>
  *__range4;
  Symbol *in_stack_ffffffffffffffc0;
  Scope *in_stack_ffffffffffffffd0;
  subrange<slang::ast::Scope::iterator,_slang::ast::Scope::iterator,_(std::ranges::subrange_kind)0>
  local_28;
  subrange<slang::ast::Scope::iterator,_slang::ast::Scope::iterator,_(std::ranges::subrange_kind)0>
  *local_18;
  
  local_28 = Scope::members(in_stack_ffffffffffffffd0);
  local_18 = &local_28;
  this_00 = std::ranges::
            subrange<slang::ast::Scope::iterator,_slang::ast::Scope::iterator,_(std::ranges::subrange_kind)0>
            ::begin(local_18);
  visitor = std::ranges::
            subrange<slang::ast::Scope::iterator,_slang::ast::Scope::iterator,_(std::ranges::subrange_kind)0>
            ::end(local_18);
  while( true ) {
    bVar1 = operator==<slang::ast::Scope::iterator>((self_type *)in_stack_ffffffffffffffc0,in_RDI);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    in_stack_ffffffffffffffc0 =
         iterator_facade<slang::ast::Scope::iterator,_false>::operator*
                   ((iterator_facade<slang::ast::Scope::iterator,_false> *)0x266558);
    Symbol::visit<no_latches_on_design::MainVisitor&>
              (this_00.current,(MainVisitor *)visitor.current);
    iterator_facade<slang::ast::Scope::iterator,_false>::operator++<slang::ast::Scope::iterator>
              ((iterator_facade<slang::ast::Scope::iterator,_false> *)in_stack_ffffffffffffffc0);
  }
  return;
}

Assistant:

void visitDefault(const T& t) {
        if constexpr (VisitExpressions && HasVisitExprs<T, TDerived>) {
            t.visitExprs(DERIVED);
        }
        else if constexpr (VisitExpressions && std::is_base_of_v<Symbol, T>) {
            if (auto declaredType = t.getDeclaredType()) {
                if (auto init = declaredType->getInitializer())
                    init->visit(DERIVED);
            }
        }

        if constexpr (VisitStatements && requires { t.visitStmts(DERIVED); }) {
            t.visitStmts(DERIVED);
        }

        if constexpr (std::is_base_of_v<GenericClassDefSymbol, T>) {
            for (auto&& spec : t.specializations())
                spec.visit(DERIVED);
        }

        if constexpr (std::is_base_of_v<Scope, T>) {
            for (auto& member : t.members())
                member.visit(DERIVED);
        }

        if constexpr (std::is_same_v<InstanceSymbol, T>) {
            if constexpr (VisitCanonical) {
                const auto& body = t.getCanonicalBody() ? *t.getCanonicalBody() : t.body;
                body.visit(DERIVED);
            }
            else {
                t.body.visit(DERIVED);
            }
        }

        if constexpr (std::is_same_v<CheckerInstanceSymbol, T>) {
            t.body.visit(DERIVED);
        }
    }